

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O0

void __thiscall DOptionMenu::Init(DOptionMenu *this,DMenu *parent,FOptionMenuDescriptor *desc)

{
  int iVar1;
  FOptionMenuDescriptor *desc_local;
  DMenu *parent_local;
  DOptionMenu *this_local;
  
  TObjPtr<DMenu>::operator=(&(this->super_DMenu).mParentMenu,parent);
  GC::WriteBarrier((DObject *)this,&parent->super_DObject);
  this->mDesc = desc;
  if ((this->mDesc != (FOptionMenuDescriptor *)0x0) && (this->mDesc->mSelectedItem == -1)) {
    iVar1 = FirstSelectable(this);
    this->mDesc->mSelectedItem = iVar1;
  }
  return;
}

Assistant:

void DOptionMenu::Init(DMenu *parent, FOptionMenuDescriptor *desc)
{
	mParentMenu = parent;
	GC::WriteBarrier(this, parent);
	mDesc = desc;
	if (mDesc != NULL && mDesc->mSelectedItem == -1) mDesc->mSelectedItem = FirstSelectable();

}